

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int wally_descriptor_parse_miniscript
              (char *miniscript,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t derive_child_num,uint32_t flags,uchar *script,size_t script_len,
              size_t *written)

{
  int iVar1;
  char **in_stack_ffffffffffffffa8;
  wally_descriptor_script_item script_item;
  
  iVar1 = -2;
  if (((script_len != 0) && (script != (uchar *)0x0)) && (written != (size_t *)0x0)) {
    *written = 0;
    wally_bzero(&script_item,0x18);
    script_item.script = script;
    script_item.script_len = script_len;
    script_item.child_num = derive_child_num;
    iVar1 = parse_miniscript(miniscript,key_name_array,key_value_array,array_len,flags,1,
                             (uint32_t *)0x0,0,0,&script_item,1,(uint32_t *)0x0,
                             in_stack_ffffffffffffffa8);
    if (iVar1 == 0) {
      *written = script_item.script_len;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_descriptor_parse_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t derive_child_num,
    uint32_t flags,
    unsigned char *script,
    size_t script_len,
    size_t *written)
{
    int ret;
    struct wally_descriptor_script_item script_item;

    if (!script || !written || !script_len)
        return WALLY_EINVAL;

    if (written)
        *written = 0;

    wally_bzero(&script_item, sizeof(script_item));
    script_item.child_num = derive_child_num;
    script_item.script = script;
    script_item.script_len = script_len;

    ret = parse_miniscript(
        miniscript,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT,
        NULL,
        0,
        0,
        &script_item,
        1,
        NULL,
        NULL);
    if (ret == WALLY_OK)
        *written = script_item.script_len;
    return ret;
}